

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

compare_eq_result_container<QList<QKeyCombination>,_QKeyCombination> __thiscall
QList<QKeyCombination>::operator==(QList<QKeyCombination> *this,QList<QKeyCombination> *other)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  QKeyCombination *pQVar4;
  QKeyCombination *pQVar5;
  long lVar6;
  compare_eq_result_container<QList<QKeyCombination>,_QKeyCombination> cVar7;
  bool bVar8;
  
  lVar3 = (this->d).size;
  lVar6 = (other->d).size;
  if (lVar3 == lVar6) {
    pQVar4 = (this->d).ptr;
    pQVar5 = (other->d).ptr;
    if (pQVar4 == pQVar5) {
      return true;
    }
    if (lVar3 == lVar6) {
      cVar7 = lVar3 == 0;
      if (!cVar7) {
        if (pQVar4->combination != pQVar5->combination) {
          return false;
        }
        lVar6 = 4;
        do {
          bVar8 = lVar3 << 2 == lVar6;
          if (bVar8) {
            return bVar8;
          }
          piVar1 = (int *)((long)&pQVar4->combination + lVar6);
          cVar7 = false;
          piVar2 = (int *)((long)&pQVar5->combination + lVar6);
          lVar6 = lVar6 + 4;
        } while (*piVar1 == *piVar2);
      }
      return cVar7;
    }
  }
  return false;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }